

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectGenericLoopSwitch<unsigned_long,unsigned_long,duckdb::NotEquals>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *lsel,
                SelectionVector *rsel,SelectionVector *result_sel,idx_t count,
                ValidityMask *lvalidity,ValidityMask *rvalidity,SelectionVector *true_sel,
                SelectionVector *false_sel)

{
  idx_t iVar1;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    iVar1 = SelectGenericLoopSelSwitch<unsigned_long,unsigned_long,duckdb::NotEquals,true>
                      (ldata,rdata,lsel,rsel,result_sel,count,lvalidity,rvalidity,true_sel,false_sel
                      );
    return iVar1;
  }
  iVar1 = SelectGenericLoopSelSwitch<unsigned_long,unsigned_long,duckdb::NotEquals,false>
                    (ldata,rdata,lsel,rsel,result_sel,count,lvalidity,rvalidity,true_sel,false_sel);
  return iVar1;
}

Assistant:

static inline idx_t
	SelectGenericLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                        const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                        const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                        ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
#ifndef DUCKDB_SMALLER_BINARY
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			return SelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			return SelectGenericLoopSelSwitch<LEFT_TYPE, RIGHT_TYPE, OP, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
#else
		return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP>(ldata, rdata, lsel, rsel, result_sel, count, lvalidity,
		                                                    rvalidity, true_sel, false_sel);
#endif
	}